

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qshareddata.h
# Opt level: O0

void __thiscall
QSharedDataPointer<QStyleSheetPositionData>::reset
          (QSharedDataPointer<QStyleSheetPositionData> *this,QStyleSheetPositionData *ptr)

{
  bool bVar1;
  QStyleSheetPositionData *pQVar2;
  QStyleSheetPositionData *in_RSI;
  totally_ordered_wrapper<QStyleSheetPositionData_*> *in_RDI;
  long in_FS_OFFSET;
  QStyleSheetPositionData *old;
  totally_ordered_wrapper<QStyleSheetPositionData_*> *in_stack_ffffffffffffffb8;
  totally_ordered_wrapper<QStyleSheetPositionData_*> local_18;
  totally_ordered_wrapper<QStyleSheetPositionData_*> local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = Qt::totally_ordered_wrapper<QStyleSheetPositionData_*>::get(in_RDI);
  if (in_RSI != pQVar2) {
    if (in_RSI != (QStyleSheetPositionData *)0x0) {
      QBasicAtomicInteger<int>::ref((QBasicAtomicInteger<int> *)0x4540d8);
    }
    Qt::totally_ordered_wrapper<QStyleSheetPositionData_*>::totally_ordered_wrapper
              (&local_18,in_RSI);
    local_10 = std::
               exchange<Qt::totally_ordered_wrapper<QStyleSheetPositionData*>,Qt::totally_ordered_wrapper<QStyleSheetPositionData*>>
                         (in_stack_ffffffffffffffb8,
                          (totally_ordered_wrapper<QStyleSheetPositionData_*> *)0x4540f6);
    pQVar2 = Qt::totally_ordered_wrapper<QStyleSheetPositionData_*>::get(&local_10);
    if (((pQVar2 != (QStyleSheetPositionData *)0x0) &&
        (bVar1 = QBasicAtomicInteger<int>::deref((QBasicAtomicInteger<int> *)0x45411c), !bVar1)) &&
       (pQVar2 != (QStyleSheetPositionData *)0x0)) {
      operator_delete(pQVar2,0x24);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void reset(T *ptr = nullptr) noexcept
    {
        if (ptr != d.get()) {
            if (ptr)
                ptr->ref.ref();
            T *old = std::exchange(d, Qt::totally_ordered_wrapper(ptr)).get();
            if (old && !old->ref.deref())
                delete old;
        }
    }